

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O2

bool __thiscall cmParseMumpsCoverage::LoadPackages(cmParseMumpsCoverage *this,string *d)

{
  pointer pbVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  mapped_type *pmVar3;
  pointer filename;
  string pat;
  string name;
  Glob glob;
  cmAlphaNum local_60;
  
  cmsys::Glob::Glob(&glob);
  glob.Recurse = true;
  name._M_string_length = (size_type)(d->_M_dataplus)._M_p;
  name._M_dataplus._M_p = (pointer)d->_M_string_length;
  local_60.View_._M_len = 4;
  local_60.View_._M_str = "/*.m";
  cmStrCat<>(&pat,(cmAlphaNum *)&name,&local_60);
  cmsys::Glob::FindFiles(&glob,&pat,(GlobMessages *)0x0);
  pvVar2 = cmsys::Glob::GetFiles_abi_cxx11_(&glob);
  pbVar1 = (pvVar2->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (filename = (pvVar2->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; filename != pbVar1;
      filename = filename + 1) {
    cmsys::SystemTools::GetFilenameName(&name,filename);
    std::__cxx11::string::erase((ulong)&name,name._M_string_length - 2);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->RoutineToDirectory,&name);
    std::__cxx11::string::_M_assign((string *)pmVar3);
    InitializeMumpsFile(this,filename);
    std::__cxx11::string::~string((string *)&name);
  }
  std::__cxx11::string::~string((string *)&pat);
  cmsys::Glob::~Glob(&glob);
  return true;
}

Assistant:

bool cmParseMumpsCoverage::LoadPackages(std::string const& d)
{
  cmsys::Glob glob;
  glob.RecurseOn();
  std::string pat = cmStrCat(d, "/*.m");
  glob.FindFiles(pat);
  for (std::string& file : glob.GetFiles()) {
    std::string name = cmSystemTools::GetFilenameName(file);
    name.erase(name.size() - 2);
    this->RoutineToDirectory[name] = file;
    // initialize each file, this is left out until CDash is fixed
    // to handle large numbers of files
    this->InitializeMumpsFile(file);
  }
  return true;
}